

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetAndClearException(JsValueRef *exception)

{
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  JsErrorCode JVar4;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  size_t sVar7;
  RecyclableData *pRVar8;
  JavascriptExceptionObject *this_00;
  Var pvVar9;
  JsValueRef pvVar10;
  undefined1 auStack_38 [8];
  AutoHandledExceptionType __autoHandledExceptionType;
  
  if (exception == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    *exception = (JsValueRef)0x0;
    pJVar5 = JsrtContext::GetCurrent();
    if (pJVar5 == (JsrtContext *)0x0) {
      JVar4 = JsErrorNoCurrentContext;
    }
    else {
      this = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (this == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc69,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      if ((this->recycler != (Recycler *)0x0) &&
         (bVar2 = Memory::Recycler::IsHeapEnumInProgress(this->recycler), bVar2)) {
        return JsErrorHeapEnumInProgress;
      }
      JVar4 = JsErrorInThreadServiceCallback;
      if ((this->threadContext->threadService).isInCallback == false) {
        sVar7 = ThreadContext::GetStackLimitForCurrentThread(this->threadContext);
        JVar4 = JsErrorInDisabledState;
        if (sVar7 != 0x7fffffffffffffff) {
          AutoHandledExceptionType::AutoHandledExceptionType
                    ((AutoHandledExceptionType *)auStack_38,ExceptionType_OutOfMemory);
          pRVar8 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                             (&this->threadContext->recyclableData);
          if ((pRVar8->exceptionObject).ptr == (JavascriptExceptionObject *)0x0) {
            AutoHandledExceptionType::~AutoHandledExceptionType
                      ((AutoHandledExceptionType *)auStack_38);
          }
          else {
            this_00 = Js::ScriptContext::GetAndClearRecordedException(this,(bool *)0x0);
            AutoHandledExceptionType::~AutoHandledExceptionType
                      ((AutoHandledExceptionType *)auStack_38);
            if (this_00 != (JavascriptExceptionObject *)0x0) {
              pvVar9 = Js::JavascriptExceptionObject::GetThrownObject(this_00,(ScriptContext *)0x0);
              *exception = pvVar9;
              auStack_38 = (undefined1  [8])0x0;
              ___autoHandledExceptionType = (TTDVar *)0x0;
              bVar3 = this->TTDShouldPerformRecordAction;
              if ((bool)bVar3 == true) {
                TTD::EventLog::RecordJsRTGetAndClearException
                          (this->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38
                          );
                bVar3 = this->TTDShouldPerformRecordAction;
              }
              if ((bVar3 & 1) == 0) {
                pvVar10 = *exception;
              }
              else {
                if (___autoHandledExceptionType == (TTDVar *)0x0) {
                  TTDAbort_unrecoverable_error("Why are we calling this then???");
                }
                pvVar10 = *exception;
                *___autoHandledExceptionType = pvVar10;
              }
              if (pvVar10 == (JsValueRef)0x0) {
                return JsErrorInvalidArgument;
              }
              return JsNoError;
            }
          }
          JVar4 = JsErrorInvalidArgument;
        }
      }
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsGetAndClearException(_Out_ JsValueRef *exception)
{
    PARAM_NOT_NULL(exception);
    *exception = nullptr;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);

    if (scriptContext->GetRecycler() && scriptContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (scriptContext->GetThreadContext()->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    HRESULT hr = S_OK;
    Js::JavascriptExceptionObject *recordedException = nullptr;

    BEGIN_TRANSLATE_OOM_TO_HRESULT
      if (scriptContext->HasRecordedException())
      {
          recordedException = scriptContext->GetAndClearRecordedException();
      }
    END_TRANSLATE_OOM_TO_HRESULT(hr)

    if (hr == E_OUTOFMEMORY)
    {
        recordedException = scriptContext->GetThreadContext()->GetRecordedException();
    }
    if (recordedException == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    *exception = recordedException->GetThrownObject(nullptr);

#if ENABLE_TTD
    if(hr != E_OUTOFMEMORY)
    {
        TTD::TTDJsRTActionResultAutoRecorder _actionEntryPopper;

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetAndClearException);
        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, exception);
    }
#endif

    if (*exception == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    return JsNoError;
}